

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinator.hpp
# Opt level: O2

result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t> *
__thiscall
toml::detail::
either<toml::detail::repeat<toml::detail::either<toml::detail::either<toml::detail::in_range<(char)97,(char)122>,toml::detail::in_range<(char)65,(char)90>>,toml::detail::in_range<(char)48,(char)57>,toml::detail::character<(char)45>,toml::detail::character<(char)95>>,toml::detail::at_least<1ul>>,toml::detail::either<toml::detail::sequence<toml::detail::character<(char)34>,toml::detail::repeat<toml::detail::either<toml::detail::exclude<toml::detail::either<toml::detail::in_range<(char)0,(char)31>,toml::detail::character<(char)34>,toml::detail::character<(char)92>,toml::detail::character<(char)127>>>,toml::detail::sequence<toml::detail::character<(char)92>,toml::detail::either<toml::detail::character<(char)34>,toml::detail::character<(char)92>,toml::detail::character<(char)98>,toml::detail::character<(char)102>,toml::detail::character<(char)110>,toml::detail::character<(char)114>,toml::detail::character<(char)116>,toml::detail::sequence<toml::detail::character<(char)117>,toml::detail::repeat<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>,toml::detail::exactly<4ul>>>,toml::detail::sequence<toml::detail::character<(char)85>,toml::detail::repeat<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>,toml::detail::exactly<8ul>>>>>>,toml::detail::unlimited>,toml::detail::character<(char)34>>,toml::detail::sequence<toml::detail::character<(char)39>,toml::detail::repeat<toml::detail::exclude<toml::detail::either<toml::detail::in_range<(char)0,(char)8>,toml::detail::in_range<(char)16,(char)25>,toml::detail::character<(char)39>>>,toml::detail::unlimited>,toml::detail::character<(char)39>>>>
::invoke<std::vector<char,std::allocator<char>>>
          (result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
           *__return_storage_ptr__,
          either<toml::detail::repeat<toml::detail::either<toml::detail::either<toml::detail::in_range<(char)97,(char)122>,toml::detail::in_range<(char)65,(char)90>>,toml::detail::in_range<(char)48,(char)57>,toml::detail::character<(char)45>,toml::detail::character<(char)95>>,toml::detail::at_least<1ul>>,toml::detail::either<toml::detail::sequence<toml::detail::character<(char)34>,toml::detail::repeat<toml::detail::either<toml::detail::exclude<toml::detail::either<toml::detail::in_range<(char)0,(char)31>,toml::detail::character<(char)34>,toml::detail::character<(char)92>,toml::detail::character<(char)127>>>,toml::detail::sequence<toml::detail::character<(char)92>,toml::detail::either<toml::detail::character<(char)34>,toml::detail::character<(char)92>,toml::detail::character<(char)98>,toml::detail::character<(char)102>,toml::detail::character<(char)110>,toml::detail::character<(char)114>,toml::detail::character<(char)116>,toml::detail::sequence<toml::detail::character<(char)117>,toml::detail::repeat<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>,toml::detail::exactly<4ul>>>,toml::detail::sequence<toml::detail::character<(char)85>,toml::detail::repeat<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>,toml::detail::exactly<8ul>>>>>>,toml::detail::unlimited>,toml::detail::character<(char)34>>,toml::detail::sequence<toml::detail::character<(char)39>,toml::detail::repeat<toml::detail::exclude<toml::detail::either<toml::detail::in_range<(char)0,(char)8>,toml::detail::in_range<(char)16,(char)25>,toml::detail::character<(char)39>>>,toml::detail::unlimited>,toml::detail::character<(char)39>>>>
          *this,location<std::vector<char,_std::allocator<char>_>_> *loc)

{
  location<std::vector<char,_std::allocator<char>_>_> *loc_00;
  result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
  *prVar1;
  result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t> rslt
  ;
  result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
  local_68;
  
  prVar1 = &local_68;
  repeat<toml::detail::either<toml::detail::either<toml::detail::in_range<(char)97,(char)122>,toml::detail::in_range<(char)65,(char)90>>,toml::detail::in_range<(char)48,(char)57>,toml::detail::character<(char)45>,toml::detail::character<(char)95>>,toml::detail::at_least<1ul>>
  ::invoke<std::vector<char,std::allocator<char>>>
            (&local_68,
             (repeat<toml::detail::either<toml::detail::either<toml::detail::in_range<(char)97,(char)122>,toml::detail::in_range<(char)65,(char)90>>,toml::detail::in_range<(char)48,(char)57>,toml::detail::character<(char)45>,toml::detail::character<(char)95>>,toml::detail::at_least<1ul>>
              *)this,loc);
  if (local_68.is_ok_ == true) {
    result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>::
    result(__return_storage_ptr__,&local_68);
    this = (either<toml::detail::repeat<toml::detail::either<toml::detail::either<toml::detail::in_range<(char)97,(char)122>,toml::detail::in_range<(char)65,(char)90>>,toml::detail::in_range<(char)48,(char)57>,toml::detail::character<(char)45>,toml::detail::character<(char)95>>,toml::detail::at_least<1ul>>,toml::detail::either<toml::detail::sequence<toml::detail::character<(char)34>,toml::detail::repeat<toml::detail::either<toml::detail::exclude<toml::detail::either<toml::detail::in_range<(char)0,(char)31>,toml::detail::character<(char)34>,toml::detail::character<(char)92>,toml::detail::character<(char)127>>>,toml::detail::sequence<toml::detail::character<(char)92>,toml::detail::either<toml::detail::character<(char)34>,toml::detail::character<(char)92>,toml::detail::character<(char)98>,toml::detail::character<(char)102>,toml::detail::character<(char)110>,toml::detail::character<(char)114>,toml::detail::character<(char)116>,toml::detail::sequence<toml::detail::character<(char)117>,toml::detail::repeat<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>,toml::detail::exactly<4ul>>>,toml::detail::sequence<toml::detail::character<(char)85>,toml::detail::repeat<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>,toml::detail::exactly<8ul>>>>>>,toml::detail::unlimited>,toml::detail::character<(char)34>>,toml::detail::sequence<toml::detail::character<(char)39>,toml::detail::repeat<toml::detail::exclude<toml::detail::either<toml::detail::in_range<(char)0,(char)8>,toml::detail::in_range<(char)16,(char)25>,toml::detail::character<(char)39>>>,toml::detail::unlimited>,toml::detail::character<(char)39>>>>
            *)prVar1;
  }
  else {
    either<toml::detail::sequence<toml::detail::character<(char)34>,toml::detail::repeat<toml::detail::either<toml::detail::exclude<toml::detail::either<toml::detail::in_range<(char)0,(char)31>,toml::detail::character<(char)34>,toml::detail::character<(char)92>,toml::detail::character<(char)127>>>,toml::detail::sequence<toml::detail::character<(char)92>,toml::detail::either<toml::detail::character<(char)34>,toml::detail::character<(char)92>,toml::detail::character<(char)98>,toml::detail::character<(char)102>,toml::detail::character<(char)110>,toml::detail::character<(char)114>,toml::detail::character<(char)116>,toml::detail::sequence<toml::detail::character<(char)117>,toml::detail::repeat<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>,toml::detail::exactly<4ul>>>,toml::detail::sequence<toml::detail::character<(char)85>,toml::detail::repeat<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>,toml::detail::exactly<8ul>>>>>>,toml::detail::unlimited>,toml::detail::character<(char)34>>,toml::detail::sequence<toml::detail::character<(char)39>,toml::detail::repeat<toml::detail::exclude<toml::detail::either<toml::detail::in_range<(char)0,(char)8>,toml::detail::in_range<(char)16,(char)25>,toml::detail::character<(char)39>>>,toml::detail::unlimited>,toml::detail::character<(char)39>>>
    ::invoke<std::vector<char,std::allocator<char>>>
              (__return_storage_ptr__,
               (either<toml::detail::sequence<toml::detail::character<(char)34>,toml::detail::repeat<toml::detail::either<toml::detail::exclude<toml::detail::either<toml::detail::in_range<(char)0,(char)31>,toml::detail::character<(char)34>,toml::detail::character<(char)92>,toml::detail::character<(char)127>>>,toml::detail::sequence<toml::detail::character<(char)92>,toml::detail::either<toml::detail::character<(char)34>,toml::detail::character<(char)92>,toml::detail::character<(char)98>,toml::detail::character<(char)102>,toml::detail::character<(char)110>,toml::detail::character<(char)114>,toml::detail::character<(char)116>,toml::detail::sequence<toml::detail::character<(char)117>,toml::detail::repeat<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>,toml::detail::exactly<4ul>>>,toml::detail::sequence<toml::detail::character<(char)85>,toml::detail::repeat<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>,toml::detail::exactly<8ul>>>>>>,toml::detail::unlimited>,toml::detail::character<(char)34>>,toml::detail::sequence<toml::detail::character<(char)39>,toml::detail::repeat<toml::detail::exclude<toml::detail::either<toml::detail::in_range<(char)0,(char)8>,toml::detail::in_range<(char)16,(char)25>,toml::detail::character<(char)39>>>,toml::detail::unlimited>,toml::detail::character<(char)39>>>
                *)this,loc_00);
  }
  result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>::
  cleanup(&local_68,(EVP_PKEY_CTX *)this);
  return __return_storage_ptr__;
}

Assistant:

static result<region<Cont>, none_t>
    invoke(location<Cont>& loc)
    {
        static_assert(std::is_same<char, typename Cont::value_type>::value,
                      "internal error: container::value_type should be `char`.");

        const auto rslt = Head::invoke(loc);
        if(rslt.is_ok()) {return rslt;}
        return either<Tail...>::invoke(loc);
    }